

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode easy_transfer(Curl_multi *multi)

{
  CURLMsg *pCVar1;
  CURLMsg *msg;
  long sleep_ms;
  int local_20;
  int rc;
  int still_running;
  CURLcode result;
  CURLMcode mcode;
  _Bool done;
  Curl_multi *multi_local;
  
  result._3_1_ = CURLE_OK >> 0x18;
  still_running = 0;
  rc = 0;
  _mcode = multi;
  while ((result._3_1_ & 1) == CURLE_OK >> 0x18 && still_running == 0) {
    local_20 = 0;
    still_running = curl_multi_wait(_mcode,(curl_waitfd *)0x0,0,1000,(int *)((long)&sleep_ms + 4));
    if (still_running == CURLM_OK) {
      if ((sleep_ms._4_4_ == 0) && (curl_multi_timeout(_mcode,(long *)&msg), msg != (CURLMsg *)0x0))
      {
        if (1000 < (long)msg) {
          msg = (CURLMsg *)0x3e8;
        }
        Curl_wait_ms((int)msg);
      }
      still_running = curl_multi_perform(_mcode,&local_20);
    }
    if (((still_running == 0) && (local_20 == 0)) &&
       (pCVar1 = curl_multi_info_read(_mcode,(int *)((long)&sleep_ms + 4)), pCVar1 != (CURLMsg *)0x0
       )) {
      rc = (pCVar1->data).result;
      result._3_1_ = 1;
    }
  }
  if ((still_running != 0) && (rc = 0x2b, still_running == 3)) {
    rc = 0x1b;
  }
  return rc;
}

Assistant:

static CURLcode easy_transfer(struct Curl_multi *multi)
{
  bool done = FALSE;
  CURLMcode mcode = CURLM_OK;
  CURLcode result = CURLE_OK;

  while(!done && !mcode) {
    int still_running = 0;
    int rc;

    mcode = curl_multi_wait(multi, NULL, 0, 1000, &rc);

    if(!mcode) {
      if(!rc) {
        long sleep_ms;

        /* If it returns without any filedescriptor instantly, we need to
           avoid busy-looping during periods where it has nothing particular
           to wait for */
        curl_multi_timeout(multi, &sleep_ms);
        if(sleep_ms) {
          if(sleep_ms > 1000)
            sleep_ms = 1000;
          Curl_wait_ms((int)sleep_ms);
        }
      }

      mcode = curl_multi_perform(multi, &still_running);
    }

    /* only read 'still_running' if curl_multi_perform() return OK */
    if(!mcode && !still_running) {
      CURLMsg *msg = curl_multi_info_read(multi, &rc);
      if(msg) {
        result = msg->data.result;
        done = TRUE;
      }
    }
  }

  /* Make sure to return some kind of error if there was a multi problem */
  if(mcode) {
    result = (mcode == CURLM_OUT_OF_MEMORY) ? CURLE_OUT_OF_MEMORY :
              /* The other multi errors should never happen, so return
                 something suitably generic */
              CURLE_BAD_FUNCTION_ARGUMENT;
  }

  return result;
}